

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

SmallVector<llvm::StringRef,_2U> *
getNames(SmallVector<llvm::StringRef,_2U> *__return_storage_ptr__,DWARFDie *DIE,
        bool IncludeLinkageName)

{
  undefined8 *puVar1;
  void *__s1;
  size_t sVar2;
  int iVar3;
  char *__s;
  size_t __n;
  DWARFAbbreviationDeclaration *pDVar4;
  char *local_38;
  char *Str;
  
  (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       &__return_storage_ptr__->super_SmallVectorStorage<llvm::StringRef,_2U>;
  (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 2;
  local_38 = llvm::DWARFDie::getName(DIE,ShortName);
  if (local_38 == (char *)0x0) {
    pDVar4 = llvm::DWARFDie::getAbbreviationDeclarationPtr(DIE);
    if ((pDVar4 != (DWARFAbbreviationDeclaration *)0x0) && (pDVar4->Tag == DW_TAG_namespace)) {
      llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const(&)[22]>
                (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,
                 (char (*) [22])"(anonymous namespace)");
    }
  }
  else {
    llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
              (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,&local_38);
  }
  if ((IncludeLinkageName) && (__s = llvm::DWARFDie::getName(DIE,LinkageName), __s != (char *)0x0))
  {
    local_38 = __s;
    if ((__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size != 0) {
      puVar1 = (undefined8 *)
               (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      __s1 = (void *)*puVar1;
      sVar2 = puVar1[1];
      __n = strlen(__s);
      if (sVar2 == __n) {
        if (__n == 0) {
          return __return_storage_ptr__;
        }
        iVar3 = bcmp(__s1,__s,__n);
        if (iVar3 == 0) {
          return __return_storage_ptr__;
        }
      }
    }
    llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
              (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static SmallVector<StringRef, 2> getNames(const DWARFDie &DIE,
                                          bool IncludeLinkageName = true) {
  SmallVector<StringRef, 2> Result;
  if (const char *Str = DIE.getName(DINameKind::ShortName))
    Result.emplace_back(Str);
  else if (DIE.getTag() == dwarf::DW_TAG_namespace)
    Result.emplace_back("(anonymous namespace)");

  if (IncludeLinkageName) {
    if (const char *Str = DIE.getName(DINameKind::LinkageName)) {
      if (Result.empty() || Result[0] != Str)
        Result.emplace_back(Str);
    }
  }

  return Result;
}